

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O0

BoxArray * amrex::complementIn(Box *b,BoxArray *ba)

{
  BoxArray *in_RDX;
  BoxArray *in_RDI;
  BoxList *in_stack_ffffffffffffffc8;
  BoxArray *in_stack_ffffffffffffffd0;
  Box *in_stack_ffffffffffffffe0;
  
  BoxArray::complementIn(in_RDX,in_stack_ffffffffffffffe0);
  BoxArray::BoxArray(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  BoxList::~BoxList((BoxList *)0xfd046b);
  return in_RDI;
}

Assistant:

BoxArray
complementIn (const Box&      b,
              const BoxArray& ba)
{
    return BoxArray { ba.complementIn(b) };
}